

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O0

uint32_t libtorrent::anon_unknown_5::map_base64_char(char c)

{
  system_error *this;
  error_code local_20;
  char local_d;
  uint32_t local_c;
  char c_local;
  
  if ((c < 'A') || ('Z' < c)) {
    if ((c < 'a') || ('z' < c)) {
      if ((c < '0') || ('9' < c)) {
        if (c == '-') {
          local_c = 0x3e;
        }
        else {
          if (c != '~') {
            local_d = c;
            this = (system_error *)__cxa_allocate_exception(0x40);
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      (&local_20,invalid_escaped_string,(type *)0x0);
            boost::system::system_error::system_error(this,local_20);
            __cxa_throw(this,&boost::system::system_error::typeinfo,
                        boost::system::system_error::~system_error);
          }
          local_c = 0x3f;
        }
      }
      else {
        local_c = (int)c + 4;
      }
    }
    else {
      local_c = (int)c - 0x47;
    }
  }
  else {
    local_c = (int)c - 0x41;
  }
  return local_c;
}

Assistant:

std::uint32_t map_base64_char(char const c)
	{
		if (c >= 'A' && c <= 'Z')
			return std::uint32_t(c - 'A');
		if (c >= 'a' && c <= 'z')
			return std::uint32_t(26 + c - 'a');
		if (c >= '0' && c <= '9')
			return std::uint32_t(52 + c - '0');
		if (c == '-') return 62;
		if (c == '~') return 63;
		throw system_error(error_code(lt::errors::invalid_escaped_string));
	}